

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  ulong uVar1;
  char *pcVar2;
  xml_allocator *this;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  undefined2 *puVar6;
  undefined2 uVar7;
  void *pvVar8;
  xml_memory_page *local_38;
  
  if (source_length == 0) {
    uVar5 = *header;
    if ((uVar5 & header_mask) != 0) {
      pcVar2 = *dest;
      lVar3 = (ulong)*(ushort *)(pcVar2 + -4) * -8;
      if (*(ushort *)(pcVar2 + -2) == 0) {
        pvVar8 = *(void **)(pcVar2 + lVar3 + -0x14);
      }
      else {
        pvVar8 = (void *)((ulong)*(ushort *)(pcVar2 + -2) << 3);
      }
      anon_unknown_0::xml_allocator::deallocate_memory
                (*(xml_allocator **)((long)header - (uVar5 >> 8)),pvVar8,
                 (size_t)(pcVar2 + lVar3 + -0x2c),
                 (xml_memory_page *)((ulong)*(ushort *)(pcVar2 + -4) * 8));
      uVar5 = *header;
    }
    *dest = (char *)0x0;
    *header = ~header_mask & uVar5;
    return true;
  }
  pcVar2 = *dest;
  uVar5 = *header;
  if ((uVar5 & 0x40) == 0 && pcVar2 != (char *)0x0) {
    sVar4 = strlen(pcVar2);
    if ((uVar5 & header_mask) == 0) {
      if (source_length <= sVar4) goto LAB_001146fe;
    }
    else if ((source_length <= sVar4) && ((sVar4 < 0x20 || (sVar4 - source_length < sVar4 >> 1)))) {
LAB_001146fe:
      memcpy(pcVar2,source,source_length);
      (*dest)[source_length] = '\0';
      return true;
    }
  }
  this = *(xml_allocator **)((long)header - (uVar5 >> 8));
  uVar1 = source_length + 0xc;
  uVar5 = this->_busy_size + (uVar1 & 0xfffffffffffffff8);
  if (uVar5 < 0x7fd9) {
    local_38 = this->_root;
    puVar6 = (undefined2 *)((long)&local_38[1].allocator + this->_busy_size);
    this->_busy_size = uVar5;
  }
  else {
    puVar6 = (undefined2 *)
             anon_unknown_0::xml_allocator::allocate_memory_oob
                       (this,uVar1 & 0xfffffffffffffff8,&local_38);
    if (puVar6 == (undefined2 *)0x0) {
      return false;
    }
  }
  *puVar6 = (short)(((int)puVar6 - (int)local_38) + 0x7ffd8U >> 3);
  uVar7 = 0;
  if (uVar1 < 0x80000) {
    uVar7 = (short)(uVar1 >> 3);
  }
  puVar6[1] = uVar7;
  memcpy(puVar6 + 2,source,source_length);
  *(undefined1 *)((long)puVar6 + source_length + 4) = 0;
  uVar5 = *header;
  if ((uVar5 & header_mask) != 0) {
    pcVar2 = *dest;
    lVar3 = (ulong)*(ushort *)(pcVar2 + -4) * -8;
    if (*(ushort *)(pcVar2 + -2) == 0) {
      pvVar8 = *(void **)(pcVar2 + lVar3 + -0x14);
    }
    else {
      pvVar8 = (void *)((ulong)*(ushort *)(pcVar2 + -2) << 3);
    }
    anon_unknown_0::xml_allocator::deallocate_memory
              (this,pvVar8,(size_t)(pcVar2 + lVar3 + -0x2c),
               (xml_memory_page *)((ulong)*(ushort *)(pcVar2 + -4) * 8));
    uVar5 = *header;
  }
  *dest = (char *)(puVar6 + 2);
  *header = uVar5 | header_mask;
  return true;
}

Assistant:

PUGI__FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = 0;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI__GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}